

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  size_t i;
  size_t bddl;
  char dirbuffer [1024];
  ulong local_418;
  char local_408 [79];
  undefined1 in_stack_fffffffffffffc47;
  char *in_stack_fffffffffffffc48;
  char acStack_3a9 [937];
  
  tellmeall();
  strcpy(local_408,
         "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/benchmarks/realdata/"
        );
  local_418 = 0;
  while( true ) {
    if (8 < local_418) {
      return 0;
    }
    strcpy(acStack_3a9,datadir[local_418]);
    _Var1 = loadAndCheckAll(in_stack_fffffffffffffc48,(_Bool)in_stack_fffffffffffffc47);
    if (!_Var1) break;
    _Var1 = loadAndCheckAll(in_stack_fffffffffffffc48,(_Bool)in_stack_fffffffffffffc47);
    if (!_Var1) {
      printf("failure\n");
      return -1;
    }
    local_418 = local_418 + 1;
  }
  printf("failure\n");
  return -1;
}

Assistant:

int main() {
    tellmeall();

    char dirbuffer[1024];
    size_t bddl = strlen(BENCHMARK_DATA_DIR);
    strcpy(dirbuffer, BENCHMARK_DATA_DIR);
    for (size_t i = 0; i < sizeof(datadir) / sizeof(const char *); i++) {
        strcpy(dirbuffer + bddl, datadir[i]);
        if (!loadAndCheckAll(dirbuffer, false)) {
            printf("failure\n");
            return -1;
        }
        if (!loadAndCheckAll(dirbuffer, true)) {
            printf("failure\n");
            return -1;
        }
    }

    return EXIT_SUCCESS;
}